

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicAllFormatsLoad::Run(BasicAllFormatsLoad *this)

{
  bool bVar1;
  long lVar2;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
  local_38.m_data[0] = 1.0;
  local_38.m_data[1] = 2.0;
  local_38.m_data[2] = 3.0;
  local_38.m_data[3] = 4.0;
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 2.0;
  local_48.m_data[2] = 3.0;
  local_48.m_data[3] = 4.0;
  bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::Read<tcu::Vector<float,4>>
                    ((BasicAllFormatsLoad *)this,0x8814,&local_38,&local_48);
  lVar2 = -1;
  if (bVar1) {
    local_38.m_data[0] = 1.0;
    local_38.m_data[1] = 2.0;
    local_38.m_data[2] = 3.0;
    local_38.m_data[3] = 4.0;
    local_48.m_data[0] = 1.0;
    local_48.m_data[1] = 2.0;
    local_48.m_data[2] = 0.0;
    local_48.m_data[3] = 1.0;
    bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::Read<tcu::Vector<float,4>>
                      ((BasicAllFormatsLoad *)this,0x8230,&local_38,&local_48);
    if (bVar1) {
      local_38.m_data[0] = 1.0;
      local_38.m_data[1] = 2.0;
      local_38.m_data[2] = 3.0;
      local_38.m_data[3] = 4.0;
      local_48.m_data[0] = 1.0;
      local_48.m_data[1] = 0.0;
      local_48.m_data[2] = 0.0;
      local_48.m_data[3] = 1.0;
      bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::Read<tcu::Vector<float,4>>
                        ((BasicAllFormatsLoad *)this,0x822e,&local_38,&local_48);
      if (bVar1) {
        local_38.m_data[0] = 1.0;
        local_38.m_data[1] = 2.0;
        local_38.m_data[2] = 3.0;
        local_38.m_data[3] = 4.0;
        local_48.m_data[0] = 1.0;
        local_48.m_data[1] = 2.0;
        local_48.m_data[2] = 3.0;
        local_48.m_data[3] = 4.0;
        bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::Read<tcu::Vector<float,4>>
                          ((BasicAllFormatsLoad *)this,0x881a,&local_38,&local_48);
        if (bVar1) {
          local_38.m_data[0] = 1.0;
          local_38.m_data[1] = 2.0;
          local_38.m_data[2] = 3.0;
          local_38.m_data[3] = 4.0;
          local_48.m_data[0] = 1.0;
          local_48.m_data[1] = 2.0;
          local_48.m_data[2] = 0.0;
          local_48.m_data[3] = 1.0;
          bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::Read<tcu::Vector<float,4>>
                            ((BasicAllFormatsLoad *)this,0x822f,&local_38,&local_48);
          if (bVar1) {
            local_38.m_data[0] = 1.0;
            local_38.m_data[1] = 2.0;
            local_38.m_data[2] = 3.0;
            local_38.m_data[3] = 4.0;
            local_48.m_data[0] = 1.0;
            local_48.m_data[1] = 0.0;
            local_48.m_data[2] = 0.0;
            local_48.m_data[3] = 1.0;
            bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::Read<tcu::Vector<float,4>>
                              ((BasicAllFormatsLoad *)this,0x822d,&local_38,&local_48);
            if (bVar1) {
              local_38.m_data[0] = 1.4013e-45;
              local_38.m_data[1] = -NAN;
              local_38.m_data[2] = 4.2039e-45;
              local_38.m_data[3] = -NAN;
              local_48.m_data[0] = 1.4013e-45;
              local_48.m_data[1] = -NAN;
              local_48.m_data[2] = 4.2039e-45;
              local_48.m_data[3] = -NAN;
              bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::Read<tcu::Vector<int,4>>
                                ((BasicAllFormatsLoad *)this,0x8d82,(Vector<int,_4> *)&local_38,
                                 (Vector<int,_4> *)&local_48);
              if (bVar1) {
                local_38.m_data[0] = 1.4013e-45;
                local_38.m_data[1] = -NAN;
                local_38.m_data[2] = 4.2039e-45;
                local_38.m_data[3] = -NAN;
                local_48.m_data[0] = 1.4013e-45;
                local_48.m_data[1] = -NAN;
                local_48.m_data[2] = 0.0;
                local_48.m_data[3] = 1.4013e-45;
                bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::Read<tcu::Vector<int,4>>
                                  ((BasicAllFormatsLoad *)this,0x823b,(Vector<int,_4> *)&local_38,
                                   (Vector<int,_4> *)&local_48);
                if (bVar1) {
                  local_38.m_data[0] = 1.4013e-45;
                  local_38.m_data[1] = -NAN;
                  local_38.m_data[2] = 4.2039e-45;
                  local_38.m_data[3] = -NAN;
                  local_48.m_data[0] = 1.4013e-45;
                  local_48.m_data[1] = 0.0;
                  local_48.m_data[2] = 0.0;
                  local_48.m_data[3] = 1.4013e-45;
                  bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::
                          Read<tcu::Vector<int,4>>
                                    ((BasicAllFormatsLoad *)this,0x8235,(Vector<int,_4> *)&local_38,
                                     (Vector<int,_4> *)&local_48);
                  if (bVar1) {
                    local_38.m_data[0] = 1.0;
                    local_38.m_data[1] = 2.0;
                    local_38.m_data[2] = 3.0;
                    local_38.m_data[3] = 4.0;
                    local_48.m_data[0] = 1.0;
                    local_48.m_data[1] = 2.0;
                    local_48.m_data[2] = 3.0;
                    local_48.m_data[3] = 1.0;
                    bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::
                            Read<tcu::Vector<float,4>>
                                      ((BasicAllFormatsLoad *)this,0x8c3a,&local_38,&local_48);
                    if (bVar1) {
                      local_38.m_data[0] = 1.4013e-45;
                      local_38.m_data[1] = -NAN;
                      local_38.m_data[2] = 4.2039e-45;
                      local_38.m_data[3] = -NAN;
                      local_48.m_data[0] = 1.4013e-45;
                      local_48.m_data[1] = -NAN;
                      local_48.m_data[2] = 4.2039e-45;
                      local_48.m_data[3] = -NAN;
                      bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::
                              Read<tcu::Vector<int,4>>
                                        ((BasicAllFormatsLoad *)this,0x8d88,
                                         (Vector<int,_4> *)&local_38,(Vector<int,_4> *)&local_48);
                      if (bVar1) {
                        local_38.m_data[0] = 1.4013e-45;
                        local_38.m_data[1] = -NAN;
                        local_38.m_data[2] = 4.2039e-45;
                        local_38.m_data[3] = -NAN;
                        local_48.m_data[0] = 1.4013e-45;
                        local_48.m_data[1] = -NAN;
                        local_48.m_data[2] = 0.0;
                        local_48.m_data[3] = 1.4013e-45;
                        bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::
                                Read<tcu::Vector<int,4>>
                                          ((BasicAllFormatsLoad *)this,0x8239,
                                           (Vector<int,_4> *)&local_38,(Vector<int,_4> *)&local_48);
                        if (bVar1) {
                          local_38.m_data[0] = 1.4013e-45;
                          local_38.m_data[1] = -NAN;
                          local_38.m_data[2] = 4.2039e-45;
                          local_38.m_data[3] = -NAN;
                          local_48.m_data[0] = 1.4013e-45;
                          local_48.m_data[1] = 0.0;
                          local_48.m_data[2] = 0.0;
                          local_48.m_data[3] = 1.4013e-45;
                          bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::
                                  Read<tcu::Vector<int,4>>
                                            ((BasicAllFormatsLoad *)this,0x8233,
                                             (Vector<int,_4> *)&local_38,(Vector<int,_4> *)&local_48
                                            );
                          if (bVar1) {
                            local_38.m_data[0] = 1.4013e-45;
                            local_38.m_data[1] = -NAN;
                            local_38.m_data[2] = 4.2039e-45;
                            local_38.m_data[3] = -NAN;
                            local_48.m_data[0] = 1.4013e-45;
                            local_48.m_data[1] = -NAN;
                            local_48.m_data[2] = 4.2039e-45;
                            local_48.m_data[3] = -NAN;
                            bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::
                                    Read<tcu::Vector<int,4>>
                                              ((BasicAllFormatsLoad *)this,0x8d8e,
                                               (Vector<int,_4> *)&local_38,
                                               (Vector<int,_4> *)&local_48);
                            if (bVar1) {
                              local_38.m_data[0] = 1.4013e-45;
                              local_38.m_data[1] = -NAN;
                              local_38.m_data[2] = 4.2039e-45;
                              local_38.m_data[3] = -NAN;
                              local_48.m_data[0] = 1.4013e-45;
                              local_48.m_data[1] = -NAN;
                              local_48.m_data[2] = 0.0;
                              local_48.m_data[3] = 1.4013e-45;
                              bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::
                                      Read<tcu::Vector<int,4>>
                                                ((BasicAllFormatsLoad *)this,0x8237,
                                                 (Vector<int,_4> *)&local_38,
                                                 (Vector<int,_4> *)&local_48);
                              if (bVar1) {
                                local_38.m_data[0] = 1.4013e-45;
                                local_38.m_data[1] = -NAN;
                                local_38.m_data[2] = 4.2039e-45;
                                local_38.m_data[3] = -NAN;
                                local_48.m_data[0] = 1.4013e-45;
                                local_48.m_data[1] = 0.0;
                                local_48.m_data[2] = 0.0;
                                local_48.m_data[3] = 1.4013e-45;
                                bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::
                                        Read<tcu::Vector<int,4>>
                                                  ((BasicAllFormatsLoad *)this,0x8231,
                                                   (Vector<int,_4> *)&local_38,
                                                   (Vector<int,_4> *)&local_48);
                                if (bVar1) {
                                  local_38.m_data[0] = 0.0;
                                  local_38.m_data[1] = 1.4013e-45;
                                  local_38.m_data[2] = 2.8026e-45;
                                  local_38.m_data[3] = 4.2039e-45;
                                  local_48.m_data[0] = 0.0;
                                  local_48.m_data[1] = 1.4013e-45;
                                  local_48.m_data[2] = 2.8026e-45;
                                  local_48.m_data[3] = 4.2039e-45;
                                  bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::
                                          Read<tcu::Vector<unsigned_int,4>>
                                                    ((BasicAllFormatsLoad *)this,0x8d70,
                                                     (Vector<unsigned_int,_4> *)&local_38,
                                                     (Vector<unsigned_int,_4> *)&local_48);
                                  if (bVar1) {
                                    local_38.m_data[0] = 0.0;
                                    local_38.m_data[1] = 1.4013e-45;
                                    local_38.m_data[2] = 2.8026e-45;
                                    local_38.m_data[3] = 4.2039e-45;
                                    local_48.m_data[0] = 0.0;
                                    local_48.m_data[1] = 1.4013e-45;
                                    local_48.m_data[2] = 2.8026e-45;
                                    local_48.m_data[3] = 4.2039e-45;
                                    bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::
                                            Read<tcu::Vector<unsigned_int,4>>
                                                      ((BasicAllFormatsLoad *)this,0x906f,
                                                       (Vector<unsigned_int,_4> *)&local_38,
                                                       (Vector<unsigned_int,_4> *)&local_48);
                                    if (bVar1) {
                                      local_38.m_data[0] = 0.0;
                                      local_38.m_data[1] = 1.4013e-45;
                                      local_38.m_data[2] = 2.8026e-45;
                                      local_38.m_data[3] = 4.2039e-45;
                                      local_48.m_data[0] = 0.0;
                                      local_48.m_data[1] = 1.4013e-45;
                                      local_48.m_data[2] = 0.0;
                                      local_48.m_data[3] = 1.4013e-45;
                                      bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::
                                              Read<tcu::Vector<unsigned_int,4>>
                                                        ((BasicAllFormatsLoad *)this,0x823c,
                                                         (Vector<unsigned_int,_4> *)&local_38,
                                                         (Vector<unsigned_int,_4> *)&local_48);
                                      if (bVar1) {
                                        local_38.m_data[0] = 9.80909e-45;
                                        local_38.m_data[1] = 2.8026e-45;
                                        local_38.m_data[2] = 4.2039e-45;
                                        local_38.m_data[3] = 5.60519e-45;
                                        local_48.m_data[0] = 9.80909e-45;
                                        local_48.m_data[1] = 0.0;
                                        local_48.m_data[2] = 0.0;
                                        local_48.m_data[3] = 1.4013e-45;
                                        bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::
                                                Read<tcu::Vector<unsigned_int,4>>
                                                          ((BasicAllFormatsLoad *)this,0x8236,
                                                           (Vector<unsigned_int,_4> *)&local_38,
                                                           (Vector<unsigned_int,_4> *)&local_48);
                                        if (bVar1) {
                                          local_38.m_data[0] = 0.0;
                                          local_38.m_data[1] = 1.4013e-45;
                                          local_38.m_data[2] = 2.8026e-45;
                                          local_38.m_data[3] = 4.2039e-45;
                                          local_48.m_data[0] = 0.0;
                                          local_48.m_data[1] = 1.4013e-45;
                                          local_48.m_data[2] = 2.8026e-45;
                                          local_48.m_data[3] = 4.2039e-45;
                                          bVar1 = gl4cts::(anonymous_namespace)::BasicAllFormatsLoad
                                                  ::Read<tcu::Vector<unsigned_int,4>>
                                                            ((BasicAllFormatsLoad *)this,0x8d76,
                                                             (Vector<unsigned_int,_4> *)&local_38,
                                                             (Vector<unsigned_int,_4> *)&local_48);
                                          if (bVar1) {
                                            local_38.m_data[0] = 0.0;
                                            local_38.m_data[1] = 1.4013e-45;
                                            local_38.m_data[2] = 2.8026e-45;
                                            local_38.m_data[3] = 4.2039e-45;
                                            local_48.m_data[0] = 0.0;
                                            local_48.m_data[1] = 1.4013e-45;
                                            local_48.m_data[2] = 0.0;
                                            local_48.m_data[3] = 1.4013e-45;
                                            bVar1 = gl4cts::(anonymous_namespace)::
                                                    BasicAllFormatsLoad::
                                                    Read<tcu::Vector<unsigned_int,4>>
                                                              ((BasicAllFormatsLoad *)this,0x823a,
                                                               (Vector<unsigned_int,_4> *)&local_38,
                                                               (Vector<unsigned_int,_4> *)&local_48)
                                            ;
                                            if (bVar1) {
                                              local_38.m_data[0] = 9.80909e-45;
                                              local_38.m_data[1] = 2.8026e-45;
                                              local_38.m_data[2] = 4.2039e-45;
                                              local_38.m_data[3] = 5.60519e-45;
                                              local_48.m_data[0] = 9.80909e-45;
                                              local_48.m_data[1] = 0.0;
                                              local_48.m_data[2] = 0.0;
                                              local_48.m_data[3] = 1.4013e-45;
                                              bVar1 = gl4cts::(anonymous_namespace)::
                                                      BasicAllFormatsLoad::
                                                      Read<tcu::Vector<unsigned_int,4>>
                                                                ((BasicAllFormatsLoad *)this,0x8234,
                                                                 (Vector<unsigned_int,_4> *)
                                                                 &local_38,
                                                                 (Vector<unsigned_int,_4> *)
                                                                 &local_48);
                                              if (bVar1) {
                                                local_38.m_data[0] = 0.0;
                                                local_38.m_data[1] = 1.4013e-45;
                                                local_38.m_data[2] = 2.8026e-45;
                                                local_38.m_data[3] = 4.2039e-45;
                                                local_48.m_data[0] = 0.0;
                                                local_48.m_data[1] = 1.4013e-45;
                                                local_48.m_data[2] = 2.8026e-45;
                                                local_48.m_data[3] = 4.2039e-45;
                                                bVar1 = gl4cts::(anonymous_namespace)::
                                                        BasicAllFormatsLoad::
                                                        Read<tcu::Vector<unsigned_int,4>>
                                                                  ((BasicAllFormatsLoad *)this,
                                                                   0x8d7c,(Vector<unsigned_int,_4> *
                                                                          )&local_38,
                                                                   (Vector<unsigned_int,_4> *)
                                                                   &local_48);
                                                if (bVar1) {
                                                  local_38.m_data[0] = 0.0;
                                                  local_38.m_data[1] = 1.4013e-45;
                                                  local_38.m_data[2] = 2.8026e-45;
                                                  local_38.m_data[3] = 4.2039e-45;
                                                  local_48.m_data[0] = 0.0;
                                                  local_48.m_data[1] = 1.4013e-45;
                                                  local_48.m_data[2] = 0.0;
                                                  local_48.m_data[3] = 1.4013e-45;
                                                  bVar1 = gl4cts::(anonymous_namespace)::
                                                          BasicAllFormatsLoad::
                                                          Read<tcu::Vector<unsigned_int,4>>
                                                                    ((BasicAllFormatsLoad *)this,
                                                                     0x8238,(Vector<unsigned_int,_4>
                                                                             *)&local_38,
                                                                     (Vector<unsigned_int,_4> *)
                                                                     &local_48);
                                                  if (bVar1) {
                                                    local_38.m_data[0] = 9.80909e-45;
                                                    local_38.m_data[1] = 2.8026e-45;
                                                    local_38.m_data[2] = 4.2039e-45;
                                                    local_38.m_data[3] = 5.60519e-45;
                                                    local_48.m_data[0] = 9.80909e-45;
                                                    local_48.m_data[1] = 0.0;
                                                    local_48.m_data[2] = 0.0;
                                                    local_48.m_data[3] = 1.4013e-45;
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoad::
                                                            Read<tcu::Vector<unsigned_int,4>>
                                                                      ((BasicAllFormatsLoad *)this,
                                                                       0x8232,(
                                                  Vector<unsigned_int,_4> *)&local_38,
                                                  (Vector<unsigned_int,_4> *)&local_48);
                                                  if (bVar1) {
                                                    tcu::Vector<float,_4>::Vector(&local_38,1.0);
                                                    tcu::Vector<float,_4>::Vector(&local_48,1.0);
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoad::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((BasicAllFormatsLoad *)this,
                                                                       0x805b,&local_38,&local_48);
                                                    if (bVar1) {
                                                      tcu::Vector<float,_4>::Vector(&local_38,1.0);
                                                      tcu::Vector<float,_4>::Vector(&local_48,1.0);
                                                      bVar1 = gl4cts::(anonymous_namespace)::
                                                              BasicAllFormatsLoad::
                                                              Read<tcu::Vector<float,4>>
                                                                        ((BasicAllFormatsLoad *)this
                                                                         ,0x8059,&local_38,&local_48
                                                                        );
                                                      if (bVar1) {
                                                        tcu::Vector<float,_4>::Vector(&local_38,1.0)
                                                        ;
                                                        local_48.m_data[0] = 1.0;
                                                        local_48.m_data[1] = 1.0;
                                                        local_48.m_data[2] = 0.0;
                                                        local_48.m_data[3] = 1.0;
                                                        bVar1 = gl4cts::(anonymous_namespace)::
                                                                BasicAllFormatsLoad::
                                                                Read<tcu::Vector<float,4>>
                                                                          ((BasicAllFormatsLoad *)
                                                                           this,0x822c,&local_38,
                                                                           &local_48);
                                                        if (bVar1) {
                                                          tcu::Vector<float,_4>::Vector
                                                                    (&local_38,1.0);
                                                          local_48.m_data[0] = 1.0;
                                                          local_48.m_data[1] = 0.0;
                                                          local_48.m_data[2] = 0.0;
                                                          local_48.m_data[3] = 1.0;
                                                          bVar1 = gl4cts::(anonymous_namespace)::
                                                                  BasicAllFormatsLoad::
                                                                  Read<tcu::Vector<float,4>>
                                                                            ((BasicAllFormatsLoad *)
                                                                             this,0x822a,&local_38,
                                                                             &local_48);
                                                          if (bVar1) {
                                                            tcu::Vector<float,_4>::Vector
                                                                      (&local_38,1.0);
                                                            tcu::Vector<float,_4>::Vector
                                                                      (&local_48,1.0);
                                                            bVar1 = gl4cts::(anonymous_namespace)::
                                                                    BasicAllFormatsLoad::
                                                                    Read<tcu::Vector<float,4>>
                                                                              ((BasicAllFormatsLoad
                                                                                *)this,0x8058,
                                                                               &local_38,&local_48);
                                                            if (bVar1) {
                                                              tcu::Vector<float,_4>::Vector
                                                                        (&local_38,1.0);
                                                              local_48.m_data[0] = 1.0;
                                                              local_48.m_data[1] = 1.0;
                                                              local_48.m_data[2] = 0.0;
                                                              local_48.m_data[3] = 1.0;
                                                              bVar1 = gl4cts::(anonymous_namespace)
                                                                      ::BasicAllFormatsLoad::
                                                                      Read<tcu::Vector<float,4>>
                                                                                ((
                                                  BasicAllFormatsLoad *)this,0x822b,&local_38,
                                                  &local_48);
                                                  if (bVar1) {
                                                    tcu::Vector<float,_4>::Vector(&local_38,1.0);
                                                    local_48.m_data[0] = 1.0;
                                                    local_48.m_data[1] = 0.0;
                                                    local_48.m_data[2] = 0.0;
                                                    local_48.m_data[3] = 1.0;
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoad::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((BasicAllFormatsLoad *)this,
                                                                       0x8229,&local_38,&local_48);
                                                    if (bVar1) {
                                                      local_38.m_data[0] = 1.0;
                                                      local_38.m_data[1] = -1.0;
                                                      local_38.m_data[2] = 1.0;
                                                      local_38.m_data[3] = -1.0;
                                                      local_48.m_data[0] = 1.0;
                                                      local_48.m_data[1] = -1.0;
                                                      local_48.m_data[2] = 1.0;
                                                      local_48.m_data[3] = -1.0;
                                                      bVar1 = gl4cts::(anonymous_namespace)::
                                                              BasicAllFormatsLoad::
                                                              Read<tcu::Vector<float,4>>
                                                                        ((BasicAllFormatsLoad *)this
                                                                         ,0x8f9b,&local_38,&local_48
                                                                        );
                                                      if (bVar1) {
                                                        tcu::Vector<float,_4>::Vector
                                                                  (&local_38,-1.0);
                                                        local_48.m_data[0] = -1.0;
                                                        local_48.m_data[1] = -1.0;
                                                        local_48.m_data[2] = 0.0;
                                                        local_48.m_data[3] = 1.0;
                                                        bVar1 = gl4cts::(anonymous_namespace)::
                                                                BasicAllFormatsLoad::
                                                                Read<tcu::Vector<float,4>>
                                                                          ((BasicAllFormatsLoad *)
                                                                           this,0x8f99,&local_38,
                                                                           &local_48);
                                                        if (bVar1) {
                                                          local_38.m_data[0] = -1.0;
                                                          local_38.m_data[1] = 1.0;
                                                          local_38.m_data[2] = -1.0;
                                                          local_38.m_data[3] = 1.0;
                                                          local_48.m_data[0] = -1.0;
                                                          local_48.m_data[1] = 0.0;
                                                          local_48.m_data[2] = 0.0;
                                                          local_48.m_data[3] = 1.0;
                                                          bVar1 = gl4cts::(anonymous_namespace)::
                                                                  BasicAllFormatsLoad::
                                                                  Read<tcu::Vector<float,4>>
                                                                            ((BasicAllFormatsLoad *)
                                                                             this,0x8f98,&local_38,
                                                                             &local_48);
                                                          if (bVar1) {
                                                            local_38.m_data[0] = 1.0;
                                                            local_38.m_data[1] = -1.0;
                                                            local_38.m_data[2] = 1.0;
                                                            local_38.m_data[3] = -1.0;
                                                            local_48.m_data[0] = 1.0;
                                                            local_48.m_data[1] = -1.0;
                                                            local_48.m_data[2] = 1.0;
                                                            local_48.m_data[3] = -1.0;
                                                            bVar1 = gl4cts::(anonymous_namespace)::
                                                                    BasicAllFormatsLoad::
                                                                    Read<tcu::Vector<float,4>>
                                                                              ((BasicAllFormatsLoad
                                                                                *)this,0x8f97,
                                                                               &local_38,&local_48);
                                                            if (bVar1) {
                                                              tcu::Vector<float,_4>::Vector
                                                                        (&local_38,-1.0);
                                                              local_48.m_data[0] = -1.0;
                                                              local_48.m_data[1] = -1.0;
                                                              local_48.m_data[2] = 0.0;
                                                              local_48.m_data[3] = 1.0;
                                                              bVar1 = gl4cts::(anonymous_namespace)
                                                                      ::BasicAllFormatsLoad::
                                                                      Read<tcu::Vector<float,4>>
                                                                                ((
                                                  BasicAllFormatsLoad *)this,0x8f95,&local_38,
                                                  &local_48);
                                                  if (bVar1) {
                                                    local_38.m_data[0] = -1.0;
                                                    local_38.m_data[1] = 1.0;
                                                    local_38.m_data[2] = -1.0;
                                                    local_38.m_data[3] = 1.0;
                                                    local_48.m_data[0] = -1.0;
                                                    local_48.m_data[1] = 0.0;
                                                    local_48.m_data[2] = 0.0;
                                                    local_48.m_data[3] = 1.0;
                                                    bVar1 = gl4cts::(anonymous_namespace)::
                                                            BasicAllFormatsLoad::
                                                            Read<tcu::Vector<float,4>>
                                                                      ((BasicAllFormatsLoad *)this,
                                                                       0x8f94,&local_38,&local_48);
                                                    lVar2 = (ulong)bVar1 - 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!Read(GL_RGBA32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 4.0f)))
			return ERROR;
		if (!Read(GL_RG32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Read(GL_R32F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		if (!Read(GL_RGBA16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 4.0f)))
			return ERROR;
		if (!Read(GL_RG16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Read(GL_R16F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		if (!Read(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Read(GL_RG32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 0, 1)))
			return ERROR;
		if (!Read(GL_R32I, ivec4(1, -2, 3, -4), ivec4(1, 0, 0, 1)))
			return ERROR;

		if (!Read(GL_R11F_G11F_B10F, vec4(1.0f, 2.0f, 3.0f, 4.0f), vec4(1.0f, 2.0f, 3.0f, 1.0f)))
			return ERROR;

		if (!Read(GL_RGBA16I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Read(GL_RG16I, ivec4(1, -2, 3, -4), ivec4(1, -2, 0, 1)))
			return ERROR;
		if (!Read(GL_R16I, ivec4(1, -2, 3, -4), ivec4(1, 0, 0, 1)))
			return ERROR;

		if (!Read(GL_RGBA8I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Read(GL_RG8I, ivec4(1, -2, 3, -4), ivec4(1, -2, 0, 1)))
			return ERROR;
		if (!Read(GL_R8I, ivec4(1, -2, 3, -4), ivec4(1, 0, 0, 1)))
			return ERROR;

		if (!Read(GL_RGBA32UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Read(GL_RGB10_A2UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Read(GL_RG32UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 0, 1)))
			return ERROR;
		if (!Read(GL_R32UI, uvec4(7, 2, 3, 4), uvec4(7, 0, 0, 1)))
			return ERROR;

		if (!Read(GL_RGBA16UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Read(GL_RG16UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 0, 1)))
			return ERROR;
		if (!Read(GL_R16UI, uvec4(7, 2, 3, 4), uvec4(7, 0, 0, 1)))
			return ERROR;

		if (!Read(GL_RGBA8UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 2, 3)))
			return ERROR;
		if (!Read(GL_RG8UI, uvec4(0, 1, 2, 3), uvec4(0, 1, 0, 1)))
			return ERROR;
		if (!Read(GL_R8UI, uvec4(7, 2, 3, 4), uvec4(7, 0, 0, 1)))
			return ERROR;

		if (!Read(GL_RGBA16, vec4(1.0f), vec4(1.0f)))
			return ERROR;
		if (!Read(GL_RGB10_A2, vec4(1.0f), vec4(1.0f)))
			return ERROR;
		if (!Read(GL_RG16, vec4(1.0f), vec4(1.0f, 1.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Read(GL_R16, vec4(1.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		if (!Read(GL_RGBA8, vec4(1.0f), vec4(1.0f)))
			return ERROR;
		if (!Read(GL_RG8, vec4(1.0f), vec4(1.0f, 1.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Read(GL_R8, vec4(1.0f), vec4(1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		if (!Read(GL_RGBA16_SNORM, vec4(1.0f, -1.0f, 1.0f, -1.0f), vec4(1.0f, -1.0f, 1.0f, -1.0f)))
			return ERROR;
		if (!Read(GL_RG16_SNORM, vec4(-1.0f), vec4(-1.0f, -1.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Read(GL_R16_SNORM, vec4(-1.0f, 1.0f, -1.0f, 1.0f), vec4(-1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		if (!Read(GL_RGBA8_SNORM, vec4(1.0f, -1.0f, 1.0f, -1.0f), vec4(1.0f, -1.0f, 1.0f, -1.0f)))
			return ERROR;
		if (!Read(GL_RG8_SNORM, vec4(-1.0f), vec4(-1.0f, -1.0f, 0.0f, 1.0f)))
			return ERROR;
		if (!Read(GL_R8_SNORM, vec4(-1.0f, 1.0f, -1.0f, 1.0f), vec4(-1.0f, 0.0f, 0.0f, 1.0f)))
			return ERROR;

		return NO_ERROR;
	}